

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
vkt::geometry::anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest
          (GeometryExpanderRenderTest *this,TestContext *testCtx,PrimitiveTestSpec *inputPrimitives)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,inputPrimitives->name,&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,inputPrimitives->name,&local_5a);
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(char *)local_38[0],(char *)local_58[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00cec1f0;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d1a0d0;
  this->m_primitiveType = inputPrimitives->primitiveType;
  this->m_outputType = inputPrimitives->outputType;
  return;
}

Assistant:

GeometryExpanderRenderTest::GeometryExpanderRenderTest (TestContext& testCtx, const PrimitiveTestSpec& inputPrimitives)
	: TestCase			(testCtx, inputPrimitives.name, inputPrimitives.name)
	, m_primitiveType	(inputPrimitives.primitiveType)
	, m_outputType		(inputPrimitives.outputType)
{

}